

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O0

void __thiscall antlr::ASTFactory::~ASTFactory(ASTFactory *this)

{
  bool bVar1;
  iterator this_00;
  reference pppVar2;
  __normal_iterator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_**,_std::vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>_>
  *in_RDI;
  iterator i;
  pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()> *in_stack_ffffffffffffffd8;
  
  in_RDI->_M_current =
       (pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()> **)&PTR__ASTFactory_005065b0;
  this_00 = std::
            vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
            ::begin((vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
                     *)in_stack_ffffffffffffffd8);
  while( true ) {
    std::
    vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
    ::end((vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
           *)in_stack_ffffffffffffffd8);
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_**,_std::vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>_>
                               *)in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    pppVar2 = __gnu_cxx::
              __normal_iterator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_**,_std::vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>_>
              ::operator*((__normal_iterator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_**,_std::vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>_>
                           *)&stack0xfffffffffffffff0);
    if (*pppVar2 != (pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()> *)(in_RDI + 1)) {
      pppVar2 = __gnu_cxx::
                __normal_iterator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_**,_std::vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>_>
                ::operator*((__normal_iterator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_**,_std::vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>_>
                             *)&stack0xfffffffffffffff0);
      in_stack_ffffffffffffffd8 = *pppVar2;
      if (in_stack_ffffffffffffffd8 !=
          (pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()> *)0x0) {
        operator_delete(in_stack_ffffffffffffffd8,0x10);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_**,_std::vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>_>
    ::operator++((__normal_iterator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_**,_std::vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>_>
                  *)&stack0xfffffffffffffff0);
  }
  std::
  vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
  ::~vector((vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
             *)this_00._M_current);
  return;
}

Assistant:

ASTFactory::~ASTFactory()
{
	factory_descriptor_list::iterator i = nodeFactories.begin();

	while( i != nodeFactories.end() )
	{
		if( *i != &default_factory_descriptor )
			delete *i;
		++i;
	}
}